

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageDefinition
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location)

{
  bool bVar1;
  string *output;
  LocationRecorder location;
  LocationRecorder LStack_38;
  
  bVar1 = Consume(this,"message");
  if (bVar1) {
    LocationRecorder::Init(&LStack_38,message_location);
    LocationRecorder::AddPath(&LStack_38,1);
    LocationRecorder::RecordLegacyLocation(&LStack_38,&message->super_Message,NAME);
    *(byte *)message->_has_bits_ = (byte)message->_has_bits_[0] | 1;
    output = message->name_;
    if (output == (string *)internal::kEmptyString_abi_cxx11_) {
      output = (string *)operator_new(0x20);
      (output->_M_dataplus)._M_p = (pointer)&output->field_2;
      output->_M_string_length = 0;
      (output->field_2)._M_local_buf[0] = '\0';
      message->name_ = output;
    }
    bVar1 = ConsumeIdentifier(this,output,"Expected message name.");
    LocationRecorder::~LocationRecorder(&LStack_38);
    if (bVar1) {
      bVar1 = ParseMessageBlock(this,message,message_location);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Parser::ParseMessageDefinition(DescriptorProto* message,
                                    const LocationRecorder& message_location) {
  DO(Consume("message"));
  {
    LocationRecorder location(message_location,
                              DescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(
        message, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(message->mutable_name(), "Expected message name."));
  }
  DO(ParseMessageBlock(message, message_location));
  return true;
}